

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURLcode curl_easy_perform(Curl_easy *data)

{
  char *pcVar1;
  uint uVar2;
  CURLMcode CVar3;
  Curl_multi *multi;
  timediff_t tVar4;
  CURLMsg *pCVar5;
  CURLcode CVar6;
  int timeout_ms;
  uint uVar7;
  curltime cVar8;
  curltime cVar9;
  curltime newer;
  int still_running;
  sigpipe_ignore pipe_st;
  int local_d8;
  int local_d4;
  sigpipe_ignore local_d0;
  
  if (data == (Curl_easy *)0x0) {
    CVar6 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    pcVar1 = (data->set).errorbuffer;
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    if (data->multi == (Curl_multi *)0x0) {
      multi = data->multi_easy;
      if (multi == (Curl_multi *)0x0) {
        multi = Curl_multi_handle(1,3);
        if (multi == (Curl_multi *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        data->multi_easy = multi;
      }
      CVar6 = CURLE_RECURSIVE_API_CALL;
      if (multi->in_callback == false) {
        uVar7 = 0;
        curl_multi_setopt(multi,CURLMOPT_MAXCONNECTS,(data->set).maxconnects);
        CVar3 = curl_multi_add_handle(multi,data);
        if (CVar3 == CURLM_OK) {
          uVar2._0_1_ = (data->set).no_signal;
          uVar2._1_1_ = (data->set).global_dns_cache;
          uVar2._2_1_ = (data->set).tcp_nodelay;
          uVar2._3_1_ = (data->set).ignorecl;
          sigpipe_ignore((Curl_easy *)(ulong)uVar2,&local_d0);
          data->multi = multi;
          do {
            local_d4 = 0;
            cVar8 = Curl_now();
            CVar3 = curl_multi_wait(multi,(curl_waitfd *)0x0,0,1000,&local_d8);
            if (CVar3 != CURLM_OK) break;
            uVar2 = 0;
            if (local_d8 == 0) {
              cVar9 = Curl_now();
              newer._12_4_ = 0;
              newer.tv_sec = SUB128(cVar9._0_12_,0);
              newer.tv_usec = SUB124(cVar9._0_12_,8);
              cVar9._12_4_ = 0;
              cVar9.tv_sec = SUB128(cVar8._0_12_,0);
              cVar9.tv_usec = SUB124(cVar8._0_12_,8);
              tVar4 = Curl_timediff(newer,cVar9);
              if ((tVar4 < 0xb) && (uVar2 = uVar7 + 1, 1 < (int)uVar7)) {
                timeout_ms = 1 << ((byte)uVar7 & 0x1f);
                if (8 < uVar7) {
                  timeout_ms = 1000;
                }
                Curl_wait_ms(timeout_ms);
              }
            }
            uVar7 = uVar2;
            CVar3 = curl_multi_perform(multi,&local_d4);
            if ((local_d4 == 0 && CVar3 == CURLM_OK) &&
               (pCVar5 = curl_multi_info_read(multi,&local_d8), pCVar5 != (CURLMsg *)0x0)) {
              CVar6 = (pCVar5->data).result;
              goto LAB_00124976;
            }
          } while (CVar3 == CURLM_OK);
          CVar6 = (uint)(CVar3 != CURLM_OUT_OF_MEMORY) * 0x10 + CURLE_OUT_OF_MEMORY;
LAB_00124976:
          curl_multi_remove_handle(multi,data);
          if (local_d0.no_signal == false) {
            sigaction(0xd,(sigaction *)&local_d0,(sigaction *)0x0);
          }
        }
        else {
          curl_multi_cleanup(multi);
          CVar6 = CURLE_FAILED_INIT;
          if (CVar3 == CURLM_OUT_OF_MEMORY) {
            CVar6 = CURLE_OUT_OF_MEMORY;
          }
        }
      }
    }
    else {
      Curl_failf(data,"easy handle already used in multi handle");
      CVar6 = CURLE_FAILED_INIT;
    }
  }
  return CVar6;
}

Assistant:

static CURLcode easy_perform(struct Curl_easy *data, bool events)
{
  struct Curl_multi *multi;
  CURLMcode mcode;
  CURLcode result = CURLE_OK;
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->set.errorbuffer)
    /* clear this as early as possible */
    data->set.errorbuffer[0] = 0;

  if(data->multi) {
    failf(data, "easy handle already used in multi handle");
    return CURLE_FAILED_INIT;
  }

  if(data->multi_easy)
    multi = data->multi_easy;
  else {
    /* this multi handle will only ever have a single easy handled attached
       to it, so make it use minimal hashes */
    multi = Curl_multi_handle(1, 3);
    if(!multi)
      return CURLE_OUT_OF_MEMORY;
    data->multi_easy = multi;
  }

  if(multi->in_callback)
    return CURLE_RECURSIVE_API_CALL;

  /* Copy the MAXCONNECTS option to the multi handle */
  curl_multi_setopt(multi, CURLMOPT_MAXCONNECTS, data->set.maxconnects);

  mcode = curl_multi_add_handle(multi, data);
  if(mcode) {
    curl_multi_cleanup(multi);
    if(mcode == CURLM_OUT_OF_MEMORY)
      return CURLE_OUT_OF_MEMORY;
    return CURLE_FAILED_INIT;
  }

  sigpipe_ignore(data, &pipe_st);

  /* assign this after curl_multi_add_handle() since that function checks for
     it and rejects this handle otherwise */
  data->multi = multi;

  /* run the transfer */
  result = events ? easy_events(multi) : easy_transfer(multi);

  /* ignoring the return code isn't nice, but atm we can't really handle
     a failure here, room for future improvement! */
  (void)curl_multi_remove_handle(multi, data);

  sigpipe_restore(&pipe_st);

  /* The multi handle is kept alive, owned by the easy handle */
  return result;
}